

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::PostDepthShaderCase::PostDepthShaderCase(PostDepthShaderCase *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"PostDepthShader",
             "Verifies if shader functionality added in ARB_post_depth_coverage extension works as expected"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PostDepthShaderCase_020edb00;
  (this->m_vertShader)._M_dataplus._M_p = (pointer)&(this->m_vertShader).field_2;
  (this->m_vertShader)._M_string_length = 0;
  (this->m_vertShader).field_2._M_local_buf[0] = '\0';
  (this->m_fragShader1)._M_dataplus._M_p = (pointer)&(this->m_fragShader1).field_2;
  (this->m_fragShader1)._M_string_length = 0;
  (this->m_fragShader1).field_2._M_local_buf[0] = '\0';
  (this->m_fragShader2)._M_dataplus._M_p = (pointer)&(this->m_fragShader2).field_2;
  (this->m_fragShader2)._M_string_length = 0;
  (this->m_fragShader2).field_2._M_local_buf[0] = '\0';
  (this->m_fragShader3)._M_dataplus._M_p = (pointer)&(this->m_fragShader3).field_2;
  (this->m_fragShader3)._M_string_length = 0;
  (this->m_fragShader3).field_2._M_local_buf[0] = '\0';
  (this->m_fragShader4)._M_dataplus._M_p = (pointer)&(this->m_fragShader4).field_2;
  (this->m_fragShader4)._M_string_length = 0;
  (this->m_fragShader4).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PostDepthShaderCase::PostDepthShaderCase(deqp::Context& context)
	: TestCase(context, "PostDepthShader",
			   "Verifies if shader functionality added in ARB_post_depth_coverage extension works as expected")
{
	/* Left blank intentionally */
}